

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

snd_config_t * get_slave_pcm_node(snd_config_t *lconf,snd_config_t *root_pcm)

{
  snd_config_t *in_RSI;
  snd_config_t *in_RDI;
  char node_name [64];
  char *string;
  snd_config_t *pcm;
  snd_config_t *slave_def;
  snd_config_t *slave_pcm;
  int r;
  snd_config_t *local_a8;
  snd_config_t *local_98;
  char local_88 [72];
  char *local_40;
  snd_config_t *local_38;
  snd_config_t *local_30;
  snd_config_t *local_28;
  int local_1c;
  snd_config_t *local_10;
  
  local_30 = (snd_config_t *)0x0;
  local_10 = in_RDI;
  local_1c = (*cubeb_snd_config_search)(in_RSI,"slave",&local_28);
  if ((-1 < local_1c) &&
     ((local_1c = (*cubeb_snd_config_get_string)(local_28,&local_40), local_1c < 0 ||
      (local_1c = (*cubeb_snd_config_search_definition)(local_10,"pcm_slave",local_40,&local_30),
      -1 < local_1c)))) {
    if (local_30 == (snd_config_t *)0x0) {
      local_98 = local_28;
    }
    else {
      local_98 = local_30;
    }
    local_1c = (*cubeb_snd_config_search)(local_98,"pcm",&local_38);
    if (-1 < local_1c) {
      if (local_30 == (snd_config_t *)0x0) {
        local_a8 = local_28;
      }
      else {
        local_a8 = local_30;
      }
      local_1c = (*cubeb_snd_config_get_string)(local_a8,&local_40);
      if ((((-1 < local_1c) && (local_1c = snprintf(local_88,0x40,"pcm.%s",local_40), -1 < local_1c)
           ) && (local_1c < 0x41)) &&
         (local_1c = (*cubeb_snd_config_search)(local_10,local_88,&local_38), -1 < local_1c)) {
        return local_38;
      }
    }
    if (local_30 != (snd_config_t *)0x0) {
      (*cubeb_snd_config_delete)(local_30);
    }
  }
  return (snd_config_t *)0x0;
}

Assistant:

static snd_config_t *
get_slave_pcm_node(snd_config_t * lconf, snd_config_t * root_pcm)
{
  int r;
  snd_config_t * slave_pcm;
  snd_config_t * slave_def;
  snd_config_t * pcm;
  char const * string;
  char node_name[64];

  slave_def = NULL;

  r = WRAP(snd_config_search)(root_pcm, "slave", &slave_pcm);
  if (r < 0) {
    return NULL;
  }

  r = WRAP(snd_config_get_string)(slave_pcm, &string);
  if (r >= 0) {
    r = WRAP(snd_config_search_definition)(lconf, "pcm_slave", string,
                                           &slave_def);
    if (r < 0) {
      return NULL;
    }
  }

  do {
    r = WRAP(snd_config_search)(slave_def ? slave_def : slave_pcm, "pcm", &pcm);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_get_string)(slave_def ? slave_def : slave_pcm, &string);
    if (r < 0) {
      break;
    }

    r = snprintf(node_name, sizeof(node_name), "pcm.%s", string);
    if (r < 0 || r > (int)sizeof(node_name)) {
      break;
    }
    r = WRAP(snd_config_search)(lconf, node_name, &pcm);
    if (r < 0) {
      break;
    }

    return pcm;
  } while (0);

  if (slave_def) {
    WRAP(snd_config_delete)(slave_def);
  }

  return NULL;
}